

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_typeinfo(lua_State *L)

{
  int *piVar1;
  long *plVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint uVar5;
  GCstr *pGVar6;
  TValue *pTVar7;
  int iVar8;
  GCtab *t;
  
  plVar2 = *(long **)((L->glref).ptr64 + 0x180);
  plVar2[2] = (long)L;
  uVar5 = ffi_checkint(L,1);
  iVar8 = 0;
  if ((uVar5 != 0) && (iVar8 = 0, uVar5 < *(uint *)(plVar2 + 1))) {
    piVar1 = (int *)(*plVar2 + (ulong)uVar5 * 0x18);
    lua_createtable(L,0,4);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    pGVar6 = lj_str_new(L,"info",4);
    pTVar7 = lj_tab_setstr(L,t,pGVar6);
    pTVar7->n = (double)*piVar1;
    if (piVar1[1] != -1) {
      pGVar6 = lj_str_new(L,"size",4);
      pTVar7 = lj_tab_setstr(L,t,pGVar6);
      pTVar7->n = (double)piVar1[1];
    }
    if ((short)piVar1[2] != 0) {
      pGVar6 = lj_str_new(L,"sib",3);
      pTVar7 = lj_tab_setstr(L,t,pGVar6);
      pTVar7->n = (double)*(ushort *)(piVar1 + 2);
    }
    uVar3 = *(ulong *)(piVar1 + 4);
    if (uVar3 != 0) {
      if ((~*(byte *)((L->glref).ptr64 + 0x20) & *(byte *)(uVar3 + 8) & 3) != 0) {
        *(byte *)(uVar3 + 8) = *(byte *)(uVar3 + 8) ^ 3;
      }
      pGVar6 = lj_str_new(L,"name",4);
      pTVar7 = lj_tab_setstr(L,t,pGVar6);
      pTVar7->u64 = uVar3 | 0xfffd800000000000;
    }
    uVar4 = (L->glref).ptr64;
    iVar8 = 1;
    if (*(ulong *)(uVar4 + 0x18) <= *(ulong *)(uVar4 + 0x10)) {
      lj_gc_step(L);
    }
  }
  return iVar8;
}

Assistant:

LJLIB_CF(ffi_typeinfo)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = (CTypeID)ffi_checkint(L, 1);
  if (id > 0 && id < cts->top) {
    CType *ct = ctype_get(cts, id);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "info")), (int32_t)ct->info);
    if (ct->size != CTSIZE_INVALID)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "size")), (int32_t)ct->size);
    if (ct->sib)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "sib")), (int32_t)ct->sib);
    if (gcref(ct->name)) {
      GCstr *s = gco2str(gcref(ct->name));
      if (isdead(G(L), obj2gco(s))) flipwhite(obj2gco(s));
      setstrV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "name")), s);
    }
    lj_gc_check(L);
    return 1;
  }
  return 0;
}